

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTransaction::SetTxOutValue
          (ConfidentialTransaction *this,uint32_t index,Amount *value)

{
  long lVar1;
  pointer pCVar2;
  Amount *pAVar3;
  pointer __dest;
  void *pvVar4;
  CfdException *pCVar5;
  long lVar6;
  size_t sVar7;
  undefined4 in_register_00000034;
  pointer puVar8;
  ulong uVar9;
  ConfidentialValue ct_value;
  undefined1 local_a0 [32];
  byte local_80;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  Amount *local_40;
  long local_38;
  
  uVar9 = (ulong)index;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,CONCAT44(in_register_00000034,index),0x8d6,"SetTxOutValue");
  pvVar4 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if (pvVar4 == (void *)0x0) {
    return;
  }
  lVar6 = uVar9 * 0x70 + *(long *)((long)pvVar4 + 0x20);
  local_38 = uVar9 * 0xf8;
  ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_a0,
             &(this->vout_).
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar9].confidential_value_);
  if (local_80 < 2) {
    lVar1 = *(long *)(lVar6 + 0x38);
    local_a0._0_8_ = &PTR__ConfidentialValue_00723840;
    if ((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_));
    }
    if (lVar1 != 0x21) {
      ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_a0,value);
      puVar8 = (pointer)CONCAT44(local_a0._12_4_,local_a0._8_4_);
      local_78._0_8_ = (pointer)0x0;
      local_78._8_8_ = (pointer)0x0;
      local_68._M_allocated_capacity = 0;
      uVar9 = local_a0._16_8_ - (long)puVar8;
      local_40 = value;
      if (uVar9 == 0) {
        __dest = (pointer)0x0;
        sVar7 = 0;
      }
      else {
        if ((long)uVar9 < 0) {
          ::std::__throw_bad_alloc();
        }
        __dest = (pointer)operator_new(uVar9);
        puVar8 = (pointer)CONCAT44(local_a0._12_4_,local_a0._8_4_);
        sVar7 = local_a0._16_8_ - (long)puVar8;
      }
      local_68._M_allocated_capacity = (size_type)(__dest + uVar9);
      local_78._0_8_ = __dest;
      if ((pointer)local_a0._16_8_ != puVar8) {
        local_78._8_8_ = __dest;
        memmove(__dest,puVar8,sVar7);
      }
      local_78._8_8_ = __dest + sVar7;
      ByteData::GetBytes(&local_58,(ByteData *)local_78);
      if ((pointer)local_78._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_78._0_8_);
      }
      pAVar3 = local_40;
      pvVar4 = *(void **)(lVar6 + 0x30);
      sVar7 = *(size_t *)(lVar6 + 0x38);
      puVar8 = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (sVar7 != (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start) {
        sVar7 = (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (pvVar4 != (void *)0x0) {
          free(pvVar4);
          sVar7 = (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
        }
        puVar8 = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar4 = malloc(sVar7);
        *(void **)(lVar6 + 0x30) = pvVar4;
        if (pvVar4 == (void *)0x0) {
          local_78._0_8_ = "cfdcore_elements_transaction.cpp";
          local_78._8_4_ = 0x8ea;
          local_68._M_allocated_capacity = 0x5d6713;
          logger::log<>((CfdSourceLocation *)local_78,kCfdLogLevelWarning,"malloc fail.");
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          local_78._0_8_ = &local_68;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"malloc fail.","");
          CfdException::CfdException(pCVar5,kCfdMemoryFullError,(string *)local_78);
          __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
        }
        *(size_t *)(lVar6 + 0x38) = sVar7;
      }
      memcpy(pvVar4,puVar8,sVar7);
      pCVar2 = (this->vout_).
               super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (**(code **)(*(long *)((long)&(pCVar2->super_AbstractTxOut)._vptr_AbstractTxOut + local_38) +
                  0x10))((long)&(pCVar2->super_AbstractTxOut)._vptr_AbstractTxOut + local_38,pAVar3)
      ;
      if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_a0._0_8_ = &PTR__ConfidentialValue_00723840;
      if ((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_) == (void *)0x0) {
        return;
      }
      operator_delete((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_));
      return;
    }
  }
  else {
    local_a0._0_8_ = &PTR__ConfidentialValue_00723840;
    if ((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_a0._12_4_,local_a0._8_4_));
    }
  }
  local_a0._0_8_ = "cfdcore_elements_transaction.cpp";
  local_a0._8_4_ = 0x8de;
  local_a0._16_8_ = "SetTxOutValue";
  logger::log<>((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,"value is already blinded.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_a0._0_8_ = local_a0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"value is already blinded.","");
  CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)local_a0);
  __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialTransaction::SetTxOutValue(
    uint32_t index, const Amount &value) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer != nullptr) {
    struct wally_tx_output *output = tx_pointer->outputs + index;
    if (vout_[index].GetConfidentialValue().HasBlinding() ||
        (output->value_len == kConfidentialDataSize)) {
      warn(CFD_LOG_SOURCE, "value is already blinded.");
      throw CfdException(kCfdIllegalStateError, "value is already blinded.");
    }

    ConfidentialValue ct_value(value);
    const std::vector<uint8_t> &value_data = ct_value.GetData().GetBytes();
    if (output->value_len == value_data.size()) {
      memcpy(output->value, value_data.data(), output->value_len);
    } else {
      if (output->value != nullptr) free(output->value);
      output->value = (unsigned char *)malloc(value_data.size());
      if (output->value == nullptr) {
        warn(CFD_LOG_SOURCE, "malloc fail.");
        throw CfdException(kCfdMemoryFullError, "malloc fail.");
      }
      output->value_len = value_data.size();
      memcpy(output->value, value_data.data(), output->value_len);
    }

    vout_[index].SetValue(value);
    // CallbackStateChange(kStateChangeAddTxOut);
  }
}